

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemLauncher.cpp
# Opt level: O0

bool __thiscall ApprovalTests::SystemLauncher::launch(SystemLauncher *this,string *commandLine)

{
  undefined8 in_RSI;
  long *in_RDI;
  string launch;
  string local_30 [48];
  
  (**(code **)(*in_RDI + 0x18))(local_30,in_RDI,in_RSI);
  SystemUtils::runSystemCommandOrThrow((string *)launch._M_string_length,(bool)launch._7_1_);
  ::std::__cxx11::string::~string(local_30);
  return true;
}

Assistant:

bool SystemLauncher::launch(const std::string& commandLine)
    {
        std::string launch = getCommandLine(commandLine);

        SystemUtils::runSystemCommandOrThrow(launch, allowNonZeroExitCodes_);
        return true;
    }